

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

MP<136UL,_GF2::MOGrevlex<136UL>_> * __thiscall
GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>::SPoly
          (MP<136UL,_GF2::MOGrevlex<136UL>_> *this,MP<136UL,_GF2::MOGrevlex<136UL>_> *poly1,
          MP<136UL,_GF2::MOGrevlex<136UL>_> *poly2)

{
  MM<136UL> *pMVar1;
  _List_node_base *p_Var2;
  MM<136UL> m;
  MM<136UL> lm;
  WW<136UL> local_60;
  WW<136UL> local_48;
  
  WW<136UL>::SetAllZero(&local_48);
  WW<136UL>::SetAllZero(&local_60);
  std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::clear
            (&this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>);
  p_Var2 = (poly1->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next + 1;
  pMVar1 = MM<136UL>::LCM((MM<136UL> *)&local_48,(MM<136UL> *)p_Var2,
                          (MM<136UL> *)
                          ((poly2->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
                           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
                           _M_impl._M_node.super__List_node_base._M_next + 1));
  MM<136UL>::operator/=(pMVar1,(MM<136UL> *)p_Var2);
  p_Var2 = (poly1->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var2 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var2->_M_next)->
                  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl.
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)poly1) {
    WW<136UL>::operator=(&local_60,(WW<136UL> *)(p_Var2 + 1));
    WW<136UL>::operator|=(&local_60,&local_48);
    std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::push_back
              (&this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>,
               (value_type *)&local_60);
  }
  p_Var2 = (poly2->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next + 1;
  pMVar1 = MM<136UL>::LCM((MM<136UL> *)&local_48,
                          (MM<136UL> *)
                          ((poly1->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
                           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
                           _M_impl._M_node.super__List_node_base._M_next + 1),(MM<136UL> *)p_Var2);
  MM<136UL>::operator/=(pMVar1,(MM<136UL> *)p_Var2);
  p_Var2 = (poly2->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var2 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var2->_M_next)->
                  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl.
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)poly2) {
    WW<136UL>::operator=(&local_60,(WW<136UL> *)(p_Var2 + 1));
    WW<136UL>::operator|=(&local_60,&local_48);
    std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::push_back
              (&this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>,
               (value_type *)&local_60);
  }
  Normalize(this);
  return this;
}

Assistant:

MP& SPoly(const MP& poly1, const MP& poly2)
	{
		// предусловия
		assert(IsConsistent(poly1) && IsConsistent(poly2));
		assert(this != &poly1 && this != &poly2);
		// сбор мономов
		MM<_n> lm, m;
		const_iterator iter;
		SetEmpty();
		lm.LCM(poly1.LM(), poly2.LM()) /= poly1.LM();
		for (iter = poly1.begin(); ++iter != poly1.end();)
			push_back((m = *iter) *= lm);
		lm.LCM(poly1.LM(), poly2.LM()) /= poly2.LM();
		for (iter = poly2.begin(); ++iter != poly2.end();)
			push_back((m = *iter) *= lm);
		// нормализация
		Normalize();
		return *this;
	}